

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_container_iterator_t
container_init_iterator(container_t *c,uint8_t typecode,uint16_t *value)

{
  unsigned_long_long input_num;
  undefined2 *in_RDX;
  char in_SIL;
  long in_RDI;
  run_container_t *rc;
  array_container_t *ac;
  int32_t index;
  uint64_t word;
  uint32_t wordindex;
  bitset_container_t *bc;
  undefined4 local_2c;
  undefined4 local_4;
  
  if (in_SIL == '\x01') {
    local_2c = 0;
    while (input_num = *(unsigned_long_long *)(*(long *)(in_RDI + 8) + (ulong)local_2c * 8),
          input_num == 0) {
      local_2c = local_2c + 1;
    }
    local_4 = roaring_trailing_zeroes(input_num);
    local_4 = local_2c * 0x40 + local_4;
    *in_RDX = (short)local_4;
  }
  else if (in_SIL == '\x02') {
    *in_RDX = **(undefined2 **)(in_RDI + 8);
    local_4 = 0;
  }
  else {
    *in_RDX = **(undefined2 **)(in_RDI + 8);
    local_4 = 0;
  }
  return (roaring_container_iterator_t)local_4;
}

Assistant:

roaring_container_iterator_t container_init_iterator(const container_t *c,
                                                     uint8_t typecode,
                                                     uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            uint32_t wordindex = 0;
            uint64_t word;
            while ((word = bc->words[wordindex]) == 0) {
                wordindex++;
            }
            // word is non-zero
            int32_t index = wordindex * 64 + roaring_trailing_zeroes(word);
            *value = index;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = index,
            };
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            *value = ac->array[0];
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = 0,
            };
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            *value = rc->runs[0].value;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{
                .index = 0,
            };
        }
        default:
            assert(false);
            roaring_unreachable;
            return ROARING_INIT_ROARING_CONTAINER_ITERATOR_T{0};
    }
}